

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SpectrumImageTexture::Evaluate
          (SpectrumImageTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  TextureEvalContext ctx_00;
  Vector2f dst1;
  array<float,_4> aVar1;
  Vector2f dst0;
  float *pfVar2;
  Float *pFVar3;
  long in_RDI;
  undefined1 auVar4 [64];
  float fVar5;
  undefined8 uVar9;
  undefined1 auVar6 [64];
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar8 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  SampledSpectrum SVar14;
  RGB RVar15;
  RGBColorSpace *cs;
  RGB rgb;
  Point2f st;
  Vector2f dstdy;
  Vector2f dstdx;
  undefined1 auVar17 [16];
  undefined1 auVar16 [12];
  undefined1 auVar18 [24];
  undefined1 in_stack_fffffffffffffe28 [64];
  undefined4 in_stack_fffffffffffffe68;
  Float FVar19;
  undefined4 in_stack_fffffffffffffe6c;
  RGBSpectrum *in_stack_fffffffffffffe70;
  Vector2f *in_stack_fffffffffffffe78;
  Vector2f *dstdx_00;
  int line;
  TextureMapping2DHandle *this_00;
  int i;
  float level;
  RGBColorSpace *cs_00;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 uVar20;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined1 *puVar21;
  undefined1 (*pauVar22) [64];
  undefined1 in_stack_fffffffffffffed0 [16];
  Float local_e4;
  Float local_e0;
  Float local_dc;
  Float *local_d8;
  undefined8 local_d0;
  RGBColorSpace *local_c8;
  RGB local_c0;
  undefined8 local_b0;
  Float local_a8;
  undefined8 local_90;
  Float local_88;
  RGB local_84;
  undefined1 local_78 [64];
  undefined1 local_30 [8];
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  in_stack_ffffffffffffffd8;
  Tuple2<pbrt::Vector2,_float> in_stack_ffffffffffffffe0;
  float in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff4;
  float in_stack_fffffffffffffff8;
  float fStack_4;
  undefined1 extraout_var [56];
  undefined1 auVar11 [56];
  
  puVar21 = &stack0x00000048;
  pauVar22 = (undefined1 (*) [64])&stack0x00000008;
  fVar5 = (float)((ulong)in_RDI >> 0x20);
  if (*(long *)(in_RDI + 0x10) == 0) {
    SampledSpectrum::SampledSpectrum
              (in_stack_fffffffffffffe28._8_8_,in_stack_fffffffffffffe28._4_4_);
  }
  else {
    dstdx_00 = (Vector2f *)&stack0xffffffffffffffe0;
    Vector2<float>::Vector2((Vector2<float> *)0x4f4ed7);
    this_00 = (TextureMapping2DHandle *)&stack0xffffffffffffffd8;
    Vector2<float>::Vector2((Vector2<float> *)0x4f4ee9);
    auVar4 = vmovdqu64_avx512f(*pauVar22);
    local_78 = vmovdqu64_avx512f(auVar4);
    auVar4 = vmovdqu64_avx512f(local_78);
    auVar4 = vmovdqu64_avx512f(auVar4);
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffea4;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffea0;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffea8;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffeb0;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         (float)(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar21;
    ctx_00._32_8_ = pauVar22;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_RDI;
    ctx_00.dudx = (Float)(int)((ulong)in_RDI >> 0x20);
    ctx_00.dudy = (Float)in_stack_fffffffffffffed0._0_4_;
    ctx_00.dvdx = (Float)in_stack_fffffffffffffed0._4_4_;
    ctx_00.dvdy = (Float)in_stack_fffffffffffffed0._8_4_;
    ctx_00.faceIndex = in_stack_fffffffffffffed0._12_4_;
    auVar6._0_8_ = TextureMapping2DHandle::Map(this_00,ctx_00,dstdx_00,in_stack_fffffffffffffe78);
    line = (int)((ulong)dstdx_00 >> 0x20);
    auVar6._8_56_ = extraout_var;
    local_30 = (undefined1  [8])vmovlpd_avx(auVar6._0_16_);
    cs_00 = (RGBColorSpace *)local_30;
    i = 1;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)cs_00,1);
    level = 1.0 - *pfVar2;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)cs_00,i);
    *pfVar2 = level;
    uVar20 = *(undefined4 *)(in_RDI + 8);
    uVar9 = 0;
    dst0.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffff8;
    dst0.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffff4;
    dst1.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffff0;
    dst1.super_Tuple2<pbrt::Vector2,_float>.x = fVar5;
    RVar15 = MIPMap::Lookup<pbrt::RGB>
                       ((MIPMap *)in_stack_ffffffffffffffe0,
                        (Point2f *)in_stack_ffffffffffffffd8.bits,dst0,dst1);
    local_a8 = RVar15.b;
    auVar10 = (undefined1  [56])0x0;
    auVar17._8_8_ = uVar9;
    auVar17._0_8_ = RVar15._0_8_;
    local_b0 = vmovlpd_avx(auVar17);
    local_90 = local_b0;
    local_88 = local_a8;
    RVar15 = pbrt::operator*(auVar4._44_4_,auVar4._32_8_);
    local_c0.b = RVar15.b;
    auVar7._0_8_ = RVar15._0_8_;
    auVar7._8_56_ = auVar10;
    local_c0._0_8_ = vmovlpd_avx(auVar7._0_16_);
    local_84._0_8_ = local_c0._0_8_;
    local_84.b = local_c0.b;
    local_c8 = MIPMap::GetRGBColorSpace(*(MIPMap **)(in_RDI + 0x10));
    auVar18 = auVar4._32_24_;
    if (local_c8 == (RGBColorSpace *)0x0) {
      pFVar3 = RGB::operator[](&local_84,0);
      auVar16 = auVar4._4_12_;
      FVar19 = *pFVar3;
      pFVar3 = RGB::operator[](&local_84,1);
      if ((FVar19 == *pFVar3) && (!NAN(FVar19) && !NAN(*pFVar3))) {
        pFVar3 = RGB::operator[](&local_84,1);
        FVar19 = *pFVar3;
        pFVar3 = RGB::operator[](&local_84,2);
        if ((FVar19 == *pFVar3) && (!NAN(FVar19) && !NAN(*pFVar3))) {
          RGB::operator[](&local_84,0);
          SampledSpectrum::SampledSpectrum(auVar16._4_8_,auVar16._0_4_);
          goto LAB_004f5253;
        }
      }
      LogFatal<char_const(&)[37]>
                ((LogLevel)level,(char *)this_00,line,(char *)in_stack_fffffffffffffe78,
                 (char (*) [37])in_stack_fffffffffffffe70);
    }
    local_e4 = local_84.r;
    local_e0 = local_84.g;
    local_dc = local_84.b;
    local_d8 = &local_e4;
    local_d0 = 3;
    fVar5 = std::max<float>(auVar4._0_16_);
    auVar17 = auVar18._8_16_;
    auVar10 = (undefined1  [56])0x0;
    if (fVar5 <= 1.0) {
      auVar11 = extraout_var_00;
      RGBReflectanceSpectrum::RGBReflectanceSpectrum(auVar18._16_8_,auVar18._8_8_,auVar18._0_8_);
      SVar14 = RGBReflectanceSpectrum::Sample(auVar17._8_8_,auVar17._0_8_);
      auVar13._0_8_ = SVar14.values.values._8_8_;
      auVar13._8_56_ = auVar10;
      auVar4._0_8_ = SVar14.values.values._0_8_;
      auVar4._8_56_ = auVar11;
      uVar9 = vmovlpd_avx(auVar4._0_16_);
      in_stack_fffffffffffffff0 = (float)uVar9;
      in_stack_fffffffffffffff4 = (float)((ulong)uVar9 >> 0x20);
      uVar9 = vmovlpd_avx(auVar13._0_16_);
      in_stack_fffffffffffffff8 = (float)uVar9;
      fStack_4 = (float)((ulong)uVar9 >> 0x20);
    }
    else {
      auVar11 = extraout_var_00;
      RGBSpectrum::RGBSpectrum
                ((RGBSpectrum *)CONCAT44(uVar20,in_stack_fffffffffffffea0),cs_00,
                 (RGB *)CONCAT44(level,i));
      SVar14 = RGBSpectrum::Sample(in_stack_fffffffffffffe70,
                                   (SampledWavelengths *)
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      auVar12._0_8_ = SVar14.values.values._8_8_;
      auVar12._8_56_ = auVar10;
      auVar8._0_8_ = SVar14.values.values._0_8_;
      auVar8._8_56_ = auVar11;
      uVar9 = vmovlpd_avx(auVar8._0_16_);
      in_stack_fffffffffffffff0 = (float)uVar9;
      in_stack_fffffffffffffff4 = (float)((ulong)uVar9 >> 0x20);
      uVar9 = vmovlpd_avx(auVar12._0_16_);
      in_stack_fffffffffffffff8 = (float)uVar9;
      fStack_4 = (float)((ulong)uVar9 >> 0x20);
    }
  }
LAB_004f5253:
  aVar1.values[1] = in_stack_fffffffffffffff4;
  aVar1.values[0] = in_stack_fffffffffffffff0;
  aVar1.values[2] = in_stack_fffffffffffffff8;
  aVar1.values[3] = fStack_4;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

SampledSpectrum SpectrumImageTexture::Evaluate(TextureEvalContext ctx,
                                               SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    assert(!"Should not be called in GPU code");
    return SampledSpectrum(0);
#else
    if (!mipmap)
        return SampledSpectrum(scale);
    Vector2f dstdx, dstdy;
    Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
    // Texture coordinates are (0,0) in the lower left corner, but
    // image coordinates are (0,0) in the upper left.
    st[1] = 1 - st[1];
    RGB rgb = scale * mipmap->Lookup<RGB>(st, dstdx, dstdy);
    const RGBColorSpace *cs = mipmap->GetRGBColorSpace();
    if (cs != nullptr) {
        if (std::max({rgb.r, rgb.g, rgb.b}) > 1)
            return RGBSpectrum(*cs, rgb).Sample(lambda);
        return RGBReflectanceSpectrum(*cs, rgb).Sample(lambda);
    }
    // otherwise it better be a one-channel texture
    CHECK(rgb[0] == rgb[1] && rgb[1] == rgb[2]);
    return SampledSpectrum(rgb[0]);
#endif
}